

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

Duration * __thiscall absl::Duration::operator-=(Duration *this,Duration rhs)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  Duration DVar8;
  
  DVar8._8_8_ = rhs._8_8_;
  lVar6 = rhs.rep_hi_;
  uVar4 = this->rep_lo_;
  if (uVar4 == 0xffffffff) {
    return this;
  }
  uVar5 = rhs.rep_lo_;
  if (uVar5 == 0xffffffff) {
    if (lVar6 < 0) goto LAB_00142c6d;
  }
  else {
    lVar1 = this->rep_hi_;
    lVar7 = lVar1 - lVar6;
    this->rep_hi_ = lVar7;
    if (uVar4 < uVar5) {
      lVar7 = lVar7 + -1;
      this->rep_hi_ = lVar7;
      uVar4 = uVar4 + 4000000000;
    }
    this->rep_lo_ = uVar4 - uVar5;
    if (lVar6 < 0) {
      if (lVar1 <= lVar7) {
        return this;
      }
LAB_00142c6d:
      auVar2._8_8_ = 0xffffffffffffffff;
      auVar2._0_8_ = 0x7fffffffffffffff;
      auVar3 = auVar2._0_12_;
      goto LAB_00142c7a;
    }
    if (lVar7 <= lVar1) {
      return this;
    }
  }
  DVar8.rep_hi_ = -1;
  DVar8 = operator-((absl *)0x7fffffffffffffff,DVar8);
  auVar3 = DVar8._0_12_;
LAB_00142c7a:
  this->rep_hi_ = auVar3._0_8_;
  this->rep_lo_ = auVar3._8_4_;
  return this;
}

Assistant:

Duration& Duration::operator-=(Duration rhs) {
  if (time_internal::IsInfiniteDuration(*this)) return *this;
  if (time_internal::IsInfiniteDuration(rhs)) {
    return *this = rhs.rep_hi_ >= 0 ? -InfiniteDuration() : InfiniteDuration();
  }
  const int64_t orig_rep_hi = rep_hi_;
  rep_hi_ =
      DecodeTwosComp(EncodeTwosComp(rep_hi_) - EncodeTwosComp(rhs.rep_hi_));
  if (rep_lo_ < rhs.rep_lo_) {
    rep_hi_ = DecodeTwosComp(EncodeTwosComp(rep_hi_) - 1);
    rep_lo_ += kTicksPerSecond;
  }
  rep_lo_ -= rhs.rep_lo_;
  if (rhs.rep_hi_ < 0 ? rep_hi_ < orig_rep_hi : rep_hi_ > orig_rep_hi) {
    return *this = rhs.rep_hi_ >= 0 ? -InfiniteDuration() : InfiniteDuration();
  }
  return *this;
}